

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbidata.cpp
# Opt level: O3

UBool __thiscall icu_63::RBBIDataWrapper::operator==(RBBIDataWrapper *this,RBBIDataWrapper *other)

{
  RBBIDataHeader *__s1;
  RBBIDataHeader *__s2;
  int iVar1;
  
  __s1 = this->fHeader;
  __s2 = other->fHeader;
  if (__s1 == __s2) {
    return '\x01';
  }
  if (__s1->fLength == __s2->fLength) {
    iVar1 = bcmp(__s1,__s2,(ulong)__s1->fLength);
    return iVar1 == 0;
  }
  return '\0';
}

Assistant:

UBool RBBIDataWrapper::operator ==(const RBBIDataWrapper &other) const {
    if (fHeader == other.fHeader) {
        return TRUE;
    }
    if (fHeader->fLength != other.fHeader->fLength) {
        return FALSE;
    }
    if (uprv_memcmp(fHeader, other.fHeader, fHeader->fLength) == 0) {
        return TRUE;
    }
    return FALSE;
}